

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O0

void __thiscall
TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test::
~TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test
          (TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test
           *this)

{
  TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test *this_local
  ;
  
  ~TEST_AccountingTestMemoryAllocator_canAllocateAndAccountMemoryMultipleAllocations_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(AccountingTestMemoryAllocator, canAllocateAndAccountMemoryMultipleAllocations)
{
    char* memory1 = allocator->alloc_memory(10, __FILE__, __LINE__);
    char* memory2 = allocator->alloc_memory(8, __FILE__, __LINE__);
    char* memory3 = allocator->alloc_memory(12, __FILE__, __LINE__);

    allocator->free_memory(memory1, 10,  __FILE__, __LINE__);
    allocator->free_memory(memory3, 12,  __FILE__, __LINE__);

    char* memory4 = allocator->alloc_memory(15, __FILE__, __LINE__);
    char* memory5 = allocator->alloc_memory(20, __FILE__, __LINE__);

    allocator->free_memory(memory2, 8, __FILE__, __LINE__);
    allocator->free_memory(memory4, 15, __FILE__, __LINE__);
    allocator->free_memory(memory5, 20, __FILE__, __LINE__);

    char* memory6 = allocator->alloc_memory(1, __FILE__, __LINE__);
    char* memory7 = allocator->alloc_memory(100, __FILE__, __LINE__);

    allocator->free_memory(memory6, 1, __FILE__, __LINE__);
    allocator->free_memory(memory7, 100, __FILE__, __LINE__);

    LONGS_EQUAL(7, accountant.totalAllocations());
    LONGS_EQUAL(7, accountant.totalDeallocations());
}